

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O2

bool __thiscall
dg::LLVMPointsToSet::const_iterator::operator==(const_iterator *this,const_iterator *rhs)

{
  int iVar1;
  int iVar2;
  raw_ostream *prVar3;
  bool bVar4;
  
  bVar4 = this->impl == (LLVMPointsToSetImpl *)0x0 && rhs->impl == (LLVMPointsToSetImpl *)0x0;
  if (rhs->impl != (LLVMPointsToSetImpl *)0x0 && this->impl != (LLVMPointsToSetImpl *)0x0) {
    prVar3 = (raw_ostream *)llvm::errs();
    prVar3 = llvm::raw_ostream::operator<<(prVar3,"CMP");
    prVar3 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar3,this->impl);
    prVar3 = llvm::raw_ostream::operator<<(prVar3,"+");
    iVar1 = (*this->impl->_vptr_LLVMPointsToSetImpl[6])();
    prVar3 = llvm::raw_ostream::operator<<(prVar3,iVar1);
    prVar3 = llvm::raw_ostream::operator<<(prVar3," == ");
    prVar3 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar3,rhs->impl);
    prVar3 = llvm::raw_ostream::operator<<(prVar3,"+");
    iVar1 = (*rhs->impl->_vptr_LLVMPointsToSetImpl[6])();
    prVar3 = llvm::raw_ostream::operator<<(prVar3,iVar1);
    llvm::raw_ostream::operator<<(prVar3,"\n");
    if (this->impl == rhs->impl) {
      iVar1 = (*this->impl->_vptr_LLVMPointsToSetImpl[6])();
      iVar2 = (*rhs->impl->_vptr_LLVMPointsToSetImpl[6])();
      bVar4 = iVar1 == iVar2;
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool operator==(const const_iterator &rhs) const {
            if (!impl)
                return !rhs.impl;
            if (!rhs.impl)
                return !impl;

            assert(!impl->end() && rhs.impl->end());
            assert(impl == rhs.impl &&
                   "Compared unrelated iterators"); // catch bugs
            llvm::errs() << "CMP" << impl << "+" << impl->position()
                         << " == " << rhs.impl << "+" << rhs.impl->position()
                         << "\n";
            return impl == rhs.impl && impl->position() == rhs.impl->position();
        }